

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

void __thiscall QTreeWidgetItem::~QTreeWidgetItem(QTreeWidgetItem *this)

{
  QList<QTreeWidgetItem_*> *this_00;
  long lVar1;
  QTreeWidgetItem *pQVar2;
  long lVar3;
  QTreeWidgetItemPrivate *pQVar4;
  Data *pDVar5;
  long lVar6;
  QTreeModel *this_01;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  uint uVar10;
  long unaff_R15;
  
  this->_vptr_QTreeWidgetItem = (_func_int **)&PTR__QTreeWidgetItem_0081e7f0;
  bVar9 = false;
  this_01 = treeModel(this,(QTreeWidget *)0x0);
  if (this_01 != (QTreeModel *)0x0) {
    bVar9 = this_01->skipPendingSort;
    this_01->skipPendingSort = true;
  }
  pQVar2 = this->par;
  if (pQVar2 == (QTreeWidgetItem *)0x0) {
    if (this_01 == (QTreeModel *)0x0) goto LAB_005bcd59;
    if (this_01->headerItem == this) {
      this_01->headerItem = (QTreeWidgetItem *)0x0;
      goto LAB_005bcd59;
    }
    lVar3 = (this_01->rootItem->children).d.size;
    if (lVar3 == 0) {
LAB_005bccfe:
      uVar10 = 0xffffffff;
    }
    else {
      lVar7 = -8;
      do {
        uVar10 = (uint)unaff_R15;
        lVar1 = lVar3 * -8 + lVar7;
        if (lVar1 == -8) goto LAB_005bccf8;
        unaff_R15 = lVar7 + 8;
        lVar6 = lVar7 + 8;
        lVar7 = unaff_R15;
      } while (*(QTreeWidgetItem **)((long)(this_01->rootItem->children).d.ptr + lVar6) != this);
      uVar10 = (uint)(unaff_R15 >> 3);
LAB_005bccf8:
      if (lVar1 == -8) goto LAB_005bccfe;
    }
    if ((int)uVar10 < 0) goto LAB_005bcd59;
    QTreeModel::beginRemoveItems(this_01,(QTreeWidgetItem *)0x0,uVar10,1);
    pQVar2 = this_01->rootItem;
    if (((pQVar2->children).d.size != 0) && ((pQVar2->children).d.ptr[uVar10 & 0x7fffffff] == this))
    {
      QList<QTreeWidgetItem_*>::takeAt(&pQVar2->children,(ulong)(uVar10 & 0x7fffffff));
    }
  }
  else {
    lVar3 = (pQVar2->children).d.size;
    if (lVar3 == 0) {
LAB_005bcc47:
      uVar10 = 0xffffffff;
    }
    else {
      lVar7 = -8;
      do {
        uVar10 = (uint)unaff_R15;
        lVar1 = lVar3 * -8 + lVar7;
        if (lVar1 == -8) goto LAB_005bcc41;
        unaff_R15 = lVar7 + 8;
        lVar6 = lVar7 + 8;
        lVar7 = unaff_R15;
      } while (*(QTreeWidgetItem **)((long)(pQVar2->children).d.ptr + lVar6) != this);
      uVar10 = (uint)(unaff_R15 >> 3);
LAB_005bcc41:
      if (lVar1 == -8) goto LAB_005bcc47;
    }
    if ((int)uVar10 < 0) goto LAB_005bcd59;
    if (this_01 != (QTreeModel *)0x0) {
      QTreeModel::beginRemoveItems(this_01,pQVar2,uVar10,1);
    }
    pQVar2 = this->par;
    if (((pQVar2->children).d.size != 0) && ((pQVar2->children).d.ptr[uVar10 & 0x7fffffff] == this))
    {
      QList<QTreeWidgetItem_*>::takeAt(&pQVar2->children,(ulong)(uVar10 & 0x7fffffff));
    }
    if (this_01 == (QTreeModel *)0x0) goto LAB_005bcd59;
  }
  QAbstractItemModel::endRemoveRows();
LAB_005bcd59:
  if ((this->children).d.size != 0) {
    uVar8 = 0;
    do {
      pQVar2 = (this->children).d.ptr[uVar8];
      pQVar2->par = (QTreeWidgetItem *)0x0;
      pQVar2->view = (QTreeWidget *)0x0;
      if (pQVar2 != (QTreeWidgetItem *)0x0) {
        (*pQVar2->_vptr_QTreeWidgetItem[1])();
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)(this->children).d.size);
  }
  this_00 = &this->children;
  QList<QTreeWidgetItem_*>::clear(this_00);
  pQVar4 = this->d;
  if (pQVar4 != (QTreeWidgetItemPrivate *)0x0) {
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&(pQVar4->display).d);
    operator_delete(pQVar4,0x30);
  }
  if (this_01 != (QTreeModel *)0x0) {
    this_01->skipPendingSort = bVar9;
  }
  pDVar5 = (this_00->d).d;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this_00->d).d)->super_QArrayData,8,0x10);
    }
  }
  QArrayDataPointer<QList<QWidgetItemData>_>::~QArrayDataPointer(&(this->values).d);
  return;
}

Assistant:

QTreeWidgetItem::~QTreeWidgetItem()
{
    QTreeModel *model = treeModel();
    QTreeModel::SkipSorting skipSorting(model);

    if (par) {
        int i = par->children.indexOf(this);
        if (i >= 0) {
            if (model) model->beginRemoveItems(par, i, 1);
            // users _could_ do changes when connected to rowsAboutToBeRemoved,
            // so we check again to make sure 'i' is valid
            if (!par->children.isEmpty() && par->children.at(i) == this)
                par->children.takeAt(i);
            if (model) model->endRemoveItems();
        }
    } else if (model) {
        if (this == model->headerItem) {
            model->headerItem = nullptr;
        } else {
            int i = model->rootItem->children.indexOf(this);
            if (i >= 0) {
                model->beginRemoveItems(nullptr, i, 1);
                // users _could_ do changes when connected to rowsAboutToBeRemoved,
                // so we check again to make sure 'i' is valid
                if (!model->rootItem->children.isEmpty() && model->rootItem->children.at(i) == this)
                    model->rootItem->children.takeAt(i);
                model->endRemoveItems();
            }
        }
    }
    // at this point the persistent indexes for the children should also be invalidated
    // since we invalidated the parent
    for (int i = 0; i < children.size(); ++i) {
        QTreeWidgetItem *child = children.at(i);
        // make sure the child does not try to remove itself from our children list
        child->par = nullptr;
        // make sure the child does not try to remove itself from the top level list
        child->view = nullptr;
        delete child;
    }

    children.clear();
    delete d;
}